

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_BOOL qpdf_oh_is_array(qpdf_data qpdf,qpdf_oh oh)

{
  qpdf_oh oh_00;
  qpdf_data qpdf_00;
  int iVar1;
  anon_class_1_0_00000001 local_59;
  function<int_(QPDFObjectHandle_&)> local_58;
  function<int_()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_14 = oh;
  p_Stack_10 = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_is_array",0);
  qpdf_00 = p_Stack_10;
  oh_00 = local_14;
  std::function<int()>::function<int(&)(),void>((function<int()> *)&local_38,return_false);
  std::function<int(QPDFObjectHandle&)>::function<qpdf_oh_is_array::__0,void>
            ((function<int(QPDFObjectHandle&)> *)&local_58,&local_59);
  iVar1 = do_with_oh<int>(qpdf_00,oh_00,&local_38,&local_58);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_58);
  std::function<int_()>::~function(&local_38);
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_is_array(qpdf_data qpdf, qpdf_oh oh)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_is_array");
    return do_with_oh<QPDF_BOOL>(
        qpdf, oh, return_false, [](QPDFObjectHandle& o) { return o.isArray(); });
}